

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O2

void int_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                 JSAMPARRAY *output_data_ptr)

{
  byte bVar1;
  byte bVar2;
  JSAMPLE JVar3;
  JSAMPARRAY input_array;
  JSAMPLE *pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  input_array = *output_data_ptr;
  bVar1 = *(byte *)((long)&cinfo->upsample[9].need_context_rows + (long)compptr->component_index);
  bVar2 = *(byte *)((long)&cinfo->upsample[10].start_pass + (long)compptr->component_index + 2);
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < cinfo->max_v_samp_factor; lVar8 = lVar8 + (ulong)bVar2) {
    pJVar4 = input_data[lVar9];
    pJVar5 = input_array[lVar8];
    pJVar6 = pJVar5 + cinfo->output_width;
    while (pJVar5 < pJVar6) {
      JVar3 = *pJVar4;
      for (uVar7 = (uint)bVar1; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        *pJVar5 = JVar3;
        pJVar5 = pJVar5 + 1;
      }
      pJVar4 = pJVar4 + 1;
    }
    if (1 < bVar2) {
      jcopy_sample_rows(input_array,(int)lVar8,input_array,(int)lVar8 + 1,bVar2 - 1,
                        cinfo->output_width);
    }
    lVar9 = lVar9 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
int_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
             JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  my_upsample_ptr upsample = (my_upsample_ptr)cinfo->upsample;
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  register int h;
  JSAMPROW outend;
  int h_expand, v_expand;
  int inrow, outrow;

  h_expand = upsample->h_expand[compptr->component_index];
  v_expand = upsample->v_expand[compptr->component_index];

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    /* Generate one output row with proper horizontal expansion */
    inptr = input_data[inrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;
      for (h = h_expand; h > 0; h--) {
        *outptr++ = invalue;
      }
    }
    /* Generate any additional output rows by duplicating the first one */
    if (v_expand > 1) {
      jcopy_sample_rows(output_data, outrow, output_data, outrow + 1,
                        v_expand - 1, cinfo->output_width);
    }
    inrow++;
    outrow += v_expand;
  }
}